

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O1

optional<unsigned_long> __thiscall
tsbp::TwoStepBranchingProcedure::Backtrack(TwoStepBranchingProcedure *this,size_t currentNode)

{
  unsigned_long *puVar1;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  _Storage<unsigned_long,_true> _Var6;
  uint uVar7;
  ulong extraout_RDX;
  undefined8 uVar9;
  long lVar10;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var11;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __it;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var12;
  pointer puVar13;
  _Hash_node_base *p_Var14;
  optional<unsigned_long> oVar15;
  TwoStepBranchingProcedure *local_48;
  unsigned_long *local_40;
  TwoStepBranchingProcedure *local_38;
  ulong uVar8;
  
  CheckMemoryUsage();
  if ((this->nodesToDeactivate)._M_h._M_element_count == 0) goto LAB_00124008;
  _Var11._M_current =
       (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
       .super__Vector_impl_data._M_start;
  puVar1 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar10 = (long)puVar1 - (long)_Var11._M_current >> 5;
  __it._M_current = _Var11._M_current;
  local_48 = this;
  local_38 = this;
  if (0 < lVar10) {
    local_40 = ((long)puVar1 - (long)_Var11._M_current & 0xffffffffffffffe0U) + _Var11._M_current;
    lVar10 = lVar10 + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_48,_Var11);
      _Var12._M_current = _Var11._M_current;
      if (bVar3) goto LAB_00123fac;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_48,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var11._M_current + 1));
      _Var12._M_current = _Var11._M_current + 1;
      if (bVar3) goto LAB_00123fac;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_48,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var11._M_current + 2));
      _Var12._M_current = _Var11._M_current + 2;
      if (bVar3) goto LAB_00123fac;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_48,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var11._M_current + 3));
      _Var12._M_current = _Var11._M_current + 3;
      if (bVar3) goto LAB_00123fac;
      _Var11._M_current = _Var11._M_current + 4;
      lVar10 = lVar10 + -1;
      __it._M_current = local_40;
    } while (1 < lVar10);
  }
  lVar10 = (long)puVar1 - (long)__it._M_current >> 3;
  if (lVar10 == 1) {
LAB_00123f98:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_48,__it);
    _Var12._M_current = __it._M_current;
    if (!bVar3) {
      _Var12._M_current = puVar1;
    }
  }
  else if (lVar10 == 2) {
LAB_00123f85:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                      ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0> *
                       )&local_48,__it);
    _Var12._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00123f98;
    }
  }
  else {
    _Var12._M_current = puVar1;
    if ((lVar10 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::
                operator()((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                            *)&local_48,__it), _Var12._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_00123f85;
    }
  }
LAB_00123fac:
  _Var11._M_current = _Var12._M_current + 1;
  if (_Var11._M_current != puVar1 && _Var12._M_current != puVar1) {
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::$_0>::operator()
                        ((_Iter_pred<tsbp::TwoStepBranchingProcedure::Backtrack(unsigned_long)::__0>
                          *)&local_38,_Var11);
      if (!bVar3) {
        *_Var12._M_current = *_Var11._M_current;
        _Var12._M_current = _Var12._M_current + 1;
      }
      _Var11._M_current = _Var11._M_current + 1;
    } while (_Var11._M_current != puVar1);
  }
  if ((_Var12._M_current != puVar1) &&
     (puVar2 = (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish,
     puVar13 = (pointer)((long)_Var12._M_current + ((long)puVar2 - (long)puVar1)), puVar2 != puVar13
     )) {
    (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar13;
  }
LAB_00124008:
  for (p_Var14 = (this->nodesToDeactivate)._M_h._M_before_begin._M_nxt;
      p_Var14 != (_Hash_node_base *)0x0; p_Var14 = p_Var14->_M_nxt) {
    if ((long)*(int *)&p_Var14[1]._M_nxt != this->maxPlacedItemsInfeasibleNodeId) {
      std::__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_>::
      reset((__uniq_ptr_impl<tsbp::PackingRelaxed2D,_std::default_delete<tsbp::PackingRelaxed2D>_> *
            )&(this->tree).super_type.m_vertices.
              super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
              ._M_impl.super__Vector_impl_data._M_start[*(int *)&p_Var14[1]._M_nxt].
              super_StoredVertex.m_property.Packing,(pointer)0x0);
    }
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->nodesToDeactivate)._M_h);
  std::
  _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<unsigned_long&>
            ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)&this->nodesToDeactivate,&this->maxPlacedItemsInfeasibleNodeId);
  _Var6 = (_Storage<unsigned_long,_true>)
          (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  if ((pointer)_Var6._M_value ==
      (this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = 0;
  }
  else {
    sVar4 = ((long)(this->tree).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->tree).super_type.m_vertices.
                   super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    uVar7 = (int)sVar4 - (int)this->exploredNodeDisplayCount;
    uVar8 = (ulong)uVar7;
    if (this->exploredNodeDisplayInterval < (int)uVar7) {
      this->exploredNodeDisplayCount = sVar4;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TSBP \t Explored / root outedges / active nodes: ",0x30);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," / ",3);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      uVar8 = extraout_RDX;
    }
    _Var6 = (_Storage<unsigned_long,_true>)
            ((_Storage<unsigned_long,_true> *)
            ((this->activeNodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1))->_M_value;
    uVar9 = CONCAT71((int7)(uVar8 >> 8),1);
  }
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar9;
  oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var6._M_value;
  return (optional<unsigned_long>)
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> TwoStepBranchingProcedure::Backtrack(size_t currentNode)
{
    // Check here instead of IsCancelled() to avoid excessive number of memory checks.
    // According to https://stackoverflow.com/a/64166/5587903.
    CheckMemoryUsage();

    // Remove deactivated leaves.
    if (!this->nodesToDeactivate.empty())
    {
        // Delete ordersToRemove from orders according to https://en.wikipedia.org/wiki/Erase%E2%80%93remove_idiom
        this->activeNodes.erase(
            std::remove_if(
                std::begin(this->activeNodes),
                std::end(this->activeNodes),
                [&](size_t nodeToRemove)
                {
                    return this->nodesToDeactivate.contains(nodeToRemove);
                }),
            std::end(this->activeNodes));
    }

    // Clear memory from nodes that will never be used again (fathomed/pruned? What's the terminology here?).
    for (int nodeIdToDeactivate: this->nodesToDeactivate)
    {
        Node& nodeToDeactivate = this->tree[nodeIdToDeactivate];

        if (nodeIdToDeactivate == this->maxPlacedItemsInfeasibleNodeId)
        {
            continue;
        }

        nodeToDeactivate.Packing.reset();
    }

    // TODO.Performance: is this the most efficient way to clear the set?
    ////this->nodesToDeactivate = std::unordered_set<size_t>{ this->maxPlacedItemsInfeasibleNodeId };
    this->nodesToDeactivate.clear();
    this->nodesToDeactivate.emplace(this->maxPlacedItemsInfeasibleNodeId);

    if (this->activeNodes.size() == 0)
    {
        return std::nullopt;
    }

    if ((int)this->tree.m_vertices.size() - (int)this->exploredNodeDisplayCount > (int)this->exploredNodeDisplayInterval)
    {
        this->exploredNodeDisplayCount = this->tree.m_vertices.size();
        size_t outDegree = boost::out_degree(0, this->tree);

        std::cout << "TSBP \t Explored / root outedges / active nodes: " << this->tree.m_vertices.size() << " / " << outDegree << " / " << this->activeNodes.size() << "\n";
    }

    // Backtrack
    return this->activeNodes.back();
}